

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 float64_gen2(float64 xa,float64 xb,float_status *s,hard_f64_op2_fn hard,soft_f64_op2_fn soft
                    ,f64_check_fn pre,f64_check_fn post,f64_check_fn fast_test,
                    soft_f64_op2_fn fast_op)

{
  _Bool _Var1;
  soft_f64_op2_fn UNRECOVERED_JUMPTABLE;
  float64 fVar2;
  double dVar3;
  union_float64 ub;
  union_float64 ua;
  union_float64 local_40;
  union_float64 local_38;
  
  UNRECOVERED_JUMPTABLE = soft;
  local_40.s = xb;
  local_38.s = xa;
  if (((s->float_exception_flags & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    float64_input_flush2(&local_38.s,&local_40.s,s);
    xa = local_38.s;
    xb = local_40.s;
    _Var1 = (*pre)(local_38,local_40);
    if ((_Var1) &&
       ((fast_test == (f64_check_fn)0x0 ||
        (_Var1 = (*fast_test)((union_float64)xa,(union_float64)xb), UNRECOVERED_JUMPTABLE = fast_op,
        !_Var1)))) {
      dVar3 = (*hard)((double)xa,(double)xb);
      if (ABS(dVar3) == INFINITY) {
        s->float_exception_flags = s->float_exception_flags | 8;
      }
      else if (((double)((ulong)dVar3 & (ulong)DAT_00b66fc0) <= 2.2250738585072014e-308) &&
              ((UNRECOVERED_JUMPTABLE = soft, post == (f64_check_fn)0x0 ||
               (_Var1 = (*post)((union_float64)xa,(union_float64)xb), _Var1)))) goto LAB_00b14bcc;
      return (float64)dVar3;
    }
  }
LAB_00b14bcc:
  fVar2 = (*UNRECOVERED_JUMPTABLE)(xa,xb,s);
  return fVar2;
}

Assistant:

static inline float64
float64_gen2(float64 xa, float64 xb, float_status *s,
             hard_f64_op2_fn hard, soft_f64_op2_fn soft,
             f64_check_fn pre, f64_check_fn post,
             f64_check_fn fast_test, soft_f64_op2_fn fast_op)
{
    union_float64 ua, ub, ur;

    ua.s = xa;
    ub.s = xb;

    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }

    float64_input_flush2(&ua.s, &ub.s, s);
    if (unlikely(!pre(ua, ub))) {
        goto soft;
    }
    if (fast_test && fast_test(ua, ub)) {
        return fast_op(ua.s, ub.s, s);
    }

    ur.h = hard(ua.h, ub.h);
    if (unlikely(f64_is_inf(ur))) {
        s->float_exception_flags |= float_flag_overflow;
    } else if (unlikely(fabs(ur.h) <= DBL_MIN)) {
        if (post == NULL || post(ua, ub)) {
            goto soft;
        }
    }
    return ur.s;

 soft:
    return soft(ua.s, ub.s, s);
}